

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssimpCExport.cpp
# Opt level: O1

void aiCopyScene(aiScene *pIn,aiScene **pOut)

{
  if (pIn != (aiScene *)0x0 && pOut != (aiScene **)0x0) {
    Assimp::SceneCombiner::CopyScene(pOut,pIn,true);
    if (*pOut == (aiScene *)0x0) {
      __assert_fail("nullptr != in",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ScenePrivate.h"
                    ,0x57,"ScenePrivateData *Assimp::ScenePriv(aiScene *)");
    }
    *(undefined1 *)((long)(*pOut)->mPrivate + 0xc) = 1;
  }
  return;
}

Assistant:

ASSIMP_API void aiCopyScene(const aiScene* pIn, aiScene** pOut)
{
    if (!pOut || !pIn) {
        return;
    }

    SceneCombiner::CopyScene(pOut,pIn,true);
    ScenePriv(*pOut)->mIsCopy = true;
}